

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall
kj::_::XThreadEvent::fire(XThreadEvent *this)

{
  ExceptionOrValue *this_00;
  PromiseNode *pPVar1;
  NullableValue<kj::Exception> *other;
  Exception *pEVar2;
  anon_class_8_1_8991fb9c *func;
  Event *extraout_RDX;
  Event *extraout_RDX_00;
  Event *extraout_RDX_01;
  Event *pEVar3;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar4;
  Own<kj::_::Event,_std::nullptr_t> local_3b8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *local_3a8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *n_1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *_n1148;
  Exception *exception;
  Maybe<kj::Exception> local_388;
  undefined1 local_1f0 [8];
  NullableValue<kj::Exception> _exception1145;
  Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *local_28;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *n;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *_n1138;
  XThreadEvent *this_local;
  
  this_local = this;
  local_28 = readMaybe<kj::_::PromiseNode,kj::_::PromiseDisposer>
                       ((Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)
                        (in_RSI + 0x78));
  n = local_28;
  if (local_28 == (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0) {
    runCatchingExceptions<kj::_::XThreadEvent::fire()::__0>(&local_388,(kj *)&exception,func);
    other = readMaybe<kj::Exception>(&local_388);
    NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_1f0,other);
    Maybe<kj::Exception>::~Maybe(&local_388);
    pEVar2 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1f0);
    if (pEVar2 != (Exception *)0x0) {
      _n1148 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
               NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_1f0);
      this_00 = *(ExceptionOrValue **)(in_RSI + 0x50);
      pEVar2 = mv<kj::Exception>((Exception *)_n1148);
      ExceptionOrValue::addException(this_00,pEVar2);
    }
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1f0);
    local_3a8 = readMaybe<kj::_::PromiseNode,kj::_::PromiseDisposer>
                          ((Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)
                           (in_RSI + 0x78));
    n_1 = local_3a8;
    if (local_3a8 == (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0) {
      Own<kj::_::Event,_std::nullptr_t>::Own
                (&local_3b8,(Event *)(in_RSI + 0x10),&fire::DISPOSER.super_Disposer);
      Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>::Maybe
                ((Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> *)this,&local_3b8);
      Own<kj::_::Event,_std::nullptr_t>::~Own(&local_3b8);
      pEVar3 = extraout_RDX_00;
    }
    else {
      pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(local_3a8);
      (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,in_RSI + 0x10);
      Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>::Maybe
                ((Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> *)this);
      pEVar3 = extraout_RDX_01;
    }
  }
  else {
    pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(local_28);
    (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[3])
              (pPVar1,*(undefined8 *)(in_RSI + 0x50));
    Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::Maybe();
    Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::operator=
              ((Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)(in_RSI + 0x78),
               &local_30);
    Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::~Maybe(&local_30);
    Own<kj::_::Event,_std::nullptr_t>::Own
              ((Own<kj::_::Event,_std::nullptr_t> *)
               &_exception1145.field_1.value.details.builder.disposer,(Event *)(in_RSI + 0x10),
               &fire::DISPOSER.super_Disposer);
    Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> *)this,
               (Own<kj::_::Event,_std::nullptr_t> *)
               &_exception1145.field_1.value.details.builder.disposer);
    Own<kj::_::Event,_std::nullptr_t>::~Own
              ((Own<kj::_::Event,_std::nullptr_t> *)
               &_exception1145.field_1.value.details.builder.disposer);
    pEVar3 = extraout_RDX;
  }
  MVar4.ptr.ptr = pEVar3;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

Maybe<Own<Event>> XThreadEvent::fire() {
  static constexpr DelayedDoneHack DISPOSER {};

  KJ_IF_SOME(n, promiseNode) {
    n->get(result);
    promiseNode = kj::none;  // make sure to destroy in the thread that created it
    return Own<Event>(this, DISPOSER);
  } else {
    KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
      promiseNode = execute();
    })) {
      result.addException(kj::mv(exception));
    };
    KJ_IF_SOME(n, promiseNode) {
      n->onReady(this);
    } else {
      return Own<Event>(this, DISPOSER);
    }
  }